

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::InstancingGroup::init
          (InstancingGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  InstancedGridRenderTest *pIVar3;
  char *pcVar4;
  char *pcVar5;
  string local_368;
  string local_348;
  allocator<char> local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  string desc_1;
  string local_280;
  allocator<char> local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string name_1;
  undefined1 local_1d0 [4];
  int ndx_1;
  string local_1b0;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string desc;
  string local_e8;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string name;
  int iStack_28;
  int ndx;
  int gridWidths [5];
  InstancingGroup *this_local;
  
  _iStack_28 = 0x500000002;
  gridWidths[0] = 10;
  gridWidths[1] = 0x20;
  iVar2 = 100;
  gridWidths[2] = 100;
  name.field_2._12_4_ = 0;
  unique0x100009a4 = this;
  while ((int)name.field_2._12_4_ < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"draw_arrays_instanced_grid_",&local_b1);
    de::toString<int>(&local_e8,&iStack_28 + (int)name.field_2._12_4_);
    std::operator+(&local_90,&local_b0,&local_e8);
    std::operator+(&local_70,&local_90,"x");
    de::toString<int>((string *)((long)&desc.field_2 + 8),&iStack_28 + (int)name.field_2._12_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&desc.field_2 + 8));
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"DrawArraysInstanced, Grid size ",&local_189);
    de::toString<int>(&local_1b0,&iStack_28 + (int)name.field_2._12_4_);
    std::operator+(&local_168,&local_188,&local_1b0);
    std::operator+(&local_148,&local_168,"x");
    de::toString<int>((string *)local_1d0,&iStack_28 + (int)name.field_2._12_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    pIVar3 = (InstancedGridRenderTest *)operator_new(0x80);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    InstancedGridRenderTest::InstancedGridRenderTest
              (pIVar3,pCVar1,pcVar4,pcVar5,(&iStack_28)[(int)name.field_2._12_4_],false);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar3);
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)local_50);
    iVar2 = name.field_2._12_4_ + 1;
    name.field_2._12_4_ = iVar2;
  }
  name_1.field_2._12_4_ = 0;
  while ((int)name_1.field_2._12_4_ < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"draw_elements_instanced_grid_",&local_259);
    de::toString<int>(&local_280,&iStack_28 + (int)name_1.field_2._12_4_);
    std::operator+(&local_238,&local_258,&local_280);
    std::operator+(&local_218,&local_238,"x");
    de::toString<int>((string *)((long)&desc_1.field_2 + 8),&iStack_28 + (int)name_1.field_2._12_4_)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&desc_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(desc_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"DrawElementsInstanced, Grid size ",&local_321);
    de::toString<int>(&local_348,&iStack_28 + (int)name_1.field_2._12_4_);
    std::operator+(&local_300,&local_320,&local_348);
    std::operator+(&local_2e0,&local_300,"x");
    de::toString<int>(&local_368,&iStack_28 + (int)name_1.field_2._12_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                   &local_2e0,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    pIVar3 = (InstancedGridRenderTest *)operator_new(0x80);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    InstancedGridRenderTest::InstancedGridRenderTest
              (pIVar3,pCVar1,pcVar4,pcVar5,(&iStack_28)[(int)name_1.field_2._12_4_],true);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar3);
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string((string *)local_1f8);
    iVar2 = name_1.field_2._12_4_ + 1;
    name_1.field_2._12_4_ = iVar2;
  }
  return iVar2;
}

Assistant:

void InstancingGroup::init (void)
{
	const int gridWidths[] =
	{
		2,
		5,
		10,
		32,
		100,
	};

	// drawArrays
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(gridWidths); ++ndx)
	{
		const std::string name = std::string("draw_arrays_instanced_grid_") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);
		const std::string desc = std::string("DrawArraysInstanced, Grid size ") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);

		this->addChild(new InstancedGridRenderTest(m_context, name.c_str(), desc.c_str(), gridWidths[ndx], false));
	}

	// drawElements
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(gridWidths); ++ndx)
	{
		const std::string name = std::string("draw_elements_instanced_grid_") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);
		const std::string desc = std::string("DrawElementsInstanced, Grid size ") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);

		this->addChild(new InstancedGridRenderTest(m_context, name.c_str(), desc.c_str(), gridWidths[ndx], true));
	}
}